

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<double>::Transpose(TPZFMatrix<double> *this,TPZMatrix<double> *T)

{
  double *pdVar1;
  int64_t r;
  long lVar2;
  int64_t c;
  long lVar3;
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
             (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
  pdVar1 = this->fElem;
  for (lVar3 = 0; lVar3 < (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 < (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar2 = lVar2 + 1) {
      (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar3,lVar2,pdVar1);
      pdVar1 = pdVar1 + 1;
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Transpose(TPZMatrix<TVar> *const T) const{
    T->Resize( this->Cols(), this->Rows() );
    //Transposta por filas
    TVar * p = fElem;
    for ( int64_t c = 0; c < this->Cols(); c++ ) {
        for ( int64_t r = 0; r < this->Rows(); r++ ) {
            T->PutVal( c, r, *p++ );
            //            cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
        }
    }
}